

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_decoder.h
# Opt level: O3

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::DecodePredictionData
          (MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,DecoderBuffer *buffer)

{
  long lVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  uint uVar2;
  _Bit_type *p_Var3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  _Bit_type _Var10;
  byte bVar11;
  RAnsBitDecoder decoder;
  RAnsBitDecoder local_48;
  
  lVar1 = buffer->pos_ + 4;
  if (lVar1 <= buffer->data_size_) {
    uVar2 = *(uint *)(buffer->data_ + buffer->pos_);
    buffer->pos_ = lVar1;
    if (-1 < (long)(int)uVar2) {
      this_00 = &(this->predictor_).orientations_;
      std::vector<bool,_std::allocator<bool>_>::resize(this_00,(long)(int)uVar2,false);
      RAnsBitDecoder::RAnsBitDecoder(&local_48);
      bVar4 = RAnsBitDecoder::StartDecoding(&local_48,buffer);
      if (bVar4) {
        if (uVar2 != 0) {
          uVar7 = 0;
          bVar5 = 0;
          bVar11 = 1;
          do {
            bVar4 = RAnsBitDecoder::DecodeNextBit(&local_48);
            bVar6 = bVar5 ^ bVar4;
            p_Var3 = (this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            uVar8 = uVar7 >> 6;
            uVar9 = 1L << ((byte)uVar7 & 0x3f);
            if (bVar6 == 0) {
              _Var10 = ~uVar9 & p_Var3[uVar8];
            }
            else {
              _Var10 = uVar9 | p_Var3[uVar8];
            }
            bVar5 = bVar4 ^ bVar11;
            p_Var3[uVar8] = _Var10;
            uVar7 = uVar7 + 1;
            bVar11 = bVar6;
          } while (uVar2 != uVar7);
        }
        bVar4 = PredictionSchemeWrapDecodingTransform<int,_int>::DecodeTransformData
                          (&(this->
                            super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                            ).
                            super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                            .transform_,buffer);
      }
      else {
        bVar4 = false;
      }
      RAnsBitDecoder::~RAnsBitDecoder(&local_48);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool MeshPredictionSchemeTexCoordsPortableDecoder<
    DataTypeT, TransformT, MeshDataT>::DecodePredictionData(DecoderBuffer
                                                                *buffer) {
  // Decode the delta coded orientations.
  int32_t num_orientations = 0;
  if (!buffer->Decode(&num_orientations) || num_orientations < 0) {
    return false;
  }
  predictor_.ResizeOrientations(num_orientations);
  bool last_orientation = true;
  RAnsBitDecoder decoder;
  if (!decoder.StartDecoding(buffer)) {
    return false;
  }
  for (int i = 0; i < num_orientations; ++i) {
    if (!decoder.DecodeNextBit()) {
      last_orientation = !last_orientation;
    }
    predictor_.set_orientation(i, last_orientation);
  }
  decoder.EndDecoding();
  return MeshPredictionSchemeDecoder<DataTypeT, TransformT,
                                     MeshDataT>::DecodePredictionData(buffer);
}